

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall
Tokenizer::registerReplacement
          (Tokenizer *this,Identifier *identifier,vector<Token,_std::allocator<Token>_> *tokens)

{
  undefined1 local_58 [8];
  Replacement replacement;
  vector<Token,_std::allocator<Token>_> *tokens_local;
  Identifier *identifier_local;
  Tokenizer *this_local;
  
  replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tokens;
  Identifier::Identifier((Identifier *)local_58,identifier);
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)
             ((long)&replacement.identifier._name.field_2 + 8),
             (vector<Token,_std::allocator<Token>_> *)
             replacement.value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<Tokenizer::Replacement,_std::allocator<Tokenizer::Replacement>_>::push_back
            (&this->replacements,(value_type *)local_58);
  Replacement::~Replacement((Replacement *)local_58);
  return;
}

Assistant:

void Tokenizer::registerReplacement(const Identifier& identifier, std::vector<Token>& tokens)
{
	Replacement replacement { identifier, tokens };
	replacements.push_back(replacement);
}